

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressreporter.cpp
# Opt level: O1

void __thiscall pbrt::ProgressReporter::Done(ProgressReporter *this)

{
  bool bVar1;
  
  if (this->quiet == false) {
    LOCK();
    bVar1 = (this->exitThread)._M_base._M_i == false;
    if (bVar1) {
      (this->exitThread)._M_base._M_i = true;
    }
    UNLOCK();
    if (bVar1) {
      LOCK();
      (this->workDone).super___atomic_base<long>._M_i = this->totalWork;
      UNLOCK();
      LOCK();
      (this->exitThread)._M_base._M_i = true;
      UNLOCK();
      if ((this->updateThread)._M_id._M_thread != 0) {
        std::thread::join();
      }
      putchar(10);
      return;
    }
  }
  return;
}

Assistant:

void ProgressReporter::Done() {
    if (!quiet) {
#ifdef PBRT_BUILD_GPU_RENDERER
        if (gpuEvents.size()) {
            CHECK_EQ(gpuEventsLaunchedOffset.load(), gpuEvents.size());
            while (gpuEventsFinishedOffset < gpuEventsLaunchedOffset) {
                cudaError_t err =
                    cudaEventSynchronize(gpuEvents[gpuEventsFinishedOffset]);
                if (err != cudaSuccess)
                    LOG_FATAL("CUDA error: %s", cudaGetErrorString(err));
            }
            workDone = gpuEventsFinishedOffset;
        }
#endif

        // Only let one thread shut things down.
        bool fa = false;
        if (exitThread.compare_exchange_strong(fa, true)) {
            workDone = totalWork;
            exitThread = true;
            if (updateThread.joinable())
                updateThread.join();
            printf("\n");
        }
    }
}